

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int get_sleb128(int32_t *pval,uint8_t *buf,uint8_t *buf_end)

{
  int iVar1;
  uint uVar2;
  uint32_t val;
  
  iVar1 = get_leb128(&val,buf,buf_end);
  if (iVar1 < 0) {
    iVar1 = -1;
    uVar2 = 0;
  }
  else {
    uVar2 = -(val & 1) ^ val >> 1;
  }
  *pval = uVar2;
  return iVar1;
}

Assistant:

static int get_sleb128(int32_t *pval, const uint8_t *buf,
                       const uint8_t *buf_end)
{
    int ret;
    uint32_t val;
    ret = get_leb128(&val, buf, buf_end);
    if (ret < 0) {
        *pval = 0;
        return -1;
    }
    *pval = (val >> 1) ^ -(val & 1);
    return ret;
}